

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_4,_4> *
gl4cts::Math::inverse<4>(Matrix<double,_4,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *matrix)

{
  tcu *this;
  Matrix<double,_4,_4> *mat;
  double dVar1;
  GLdouble inv_det;
  GLdouble det;
  undefined1 local_118 [8];
  Matrix<double,_4,_4> adjugate;
  Matrix<double,_4,_4> cof;
  Matrix<double,_4,_4> *matrix_local;
  Matrix<double,_4,_4> *result;
  
  this = (tcu *)(adjugate.m_data.m_data[3].m_data + 3);
  cofactors<4>((Matrix<double,_4,_4> *)this,matrix);
  tcu::transpose<double,4,4>((Matrix<double,_4,_4> *)local_118,this,mat);
  dVar1 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,(Matrix<double,_4,_4> *)local_118,1.0 / dVar1);
  tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_118);
  tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)(adjugate.m_data.m_data[3].m_data + 3))
  ;
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}